

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O1

void embree::avx512::
     BVHNIntersectorKHybrid<8,_8,_1,_false,_embree::avx512::ArrayIntersectorK_1<8,_embree::avx512::TriangleMIntersectorKMoeller<4,_8,_false>_>,_true>
     ::occluded(vint<8> *valid_i,Intersectors *This,RayK<8> *ray,RayQueryContext *context)

{
  uint uVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  undefined1 auVar9 [32];
  undefined8 uVar10;
  undefined8 uVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  byte bVar17;
  int iVar18;
  byte bVar19;
  ulong uVar20;
  byte bVar21;
  ulong uVar22;
  ulong uVar23;
  byte bVar24;
  undefined4 uVar25;
  ulong uVar26;
  NodeRef root;
  long lVar27;
  undefined1 (*pauVar28) [32];
  ulong *puVar29;
  bool bVar30;
  ulong uVar31;
  undefined1 auVar32 [16];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 in_ZMM2 [64];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [64];
  undefined1 auVar56 [16];
  undefined1 auVar58 [64];
  undefined1 auVar59 [64];
  undefined1 auVar60 [64];
  undefined1 auVar61 [64];
  undefined1 in_ZMM31 [64];
  undefined1 auVar62 [64];
  Precalculations pre;
  TravRayK<8,_false> tray;
  NodeRef stack_node [561];
  vfloat<8> stack_near [561];
  Precalculations local_5aa1;
  ulong local_5aa0;
  Intersectors *local_5a98;
  undefined4 local_5a8c;
  RayK<8> *local_5a88;
  BVH *local_5a80;
  RayQueryContext *local_5a78;
  size_t local_5a70;
  RayK<8> *local_5a68;
  undefined1 local_5a60 [32];
  anon_union_96_2_4062524c_for_Vec3<embree::vfloat_impl<8>_>_1 local_5a40;
  undefined1 local_59e0 [32];
  undefined1 local_59c0 [32];
  undefined1 local_59a0 [32];
  undefined1 local_5980 [32];
  undefined1 local_5960 [32];
  undefined1 local_5940 [32];
  float local_5920;
  float fStack_591c;
  float fStack_5918;
  float fStack_5914;
  float fStack_5910;
  float fStack_590c;
  float fStack_5908;
  undefined4 uStack_5904;
  float local_5900;
  float fStack_58fc;
  float fStack_58f8;
  float fStack_58f4;
  float fStack_58f0;
  float fStack_58ec;
  float fStack_58e8;
  undefined4 uStack_58e4;
  undefined1 local_58e0 [32];
  int local_58c0;
  int iStack_58bc;
  int iStack_58b8;
  int iStack_58b4;
  int iStack_58b0;
  int iStack_58ac;
  int iStack_58a8;
  int iStack_58a4;
  uint local_58a0;
  uint uStack_589c;
  uint uStack_5898;
  uint uStack_5894;
  uint uStack_5890;
  uint uStack_588c;
  uint uStack_5888;
  uint uStack_5884;
  uint local_5880;
  uint uStack_587c;
  uint uStack_5878;
  uint uStack_5874;
  uint uStack_5870;
  uint uStack_586c;
  uint uStack_5868;
  uint uStack_5864;
  uint local_5860;
  uint uStack_585c;
  uint uStack_5858;
  uint uStack_5854;
  uint uStack_5850;
  uint uStack_584c;
  uint uStack_5848;
  uint uStack_5844;
  uint local_5840;
  uint uStack_583c;
  uint uStack_5838;
  uint uStack_5834;
  uint uStack_5830;
  uint uStack_582c;
  uint uStack_5828;
  uint uStack_5824;
  undefined8 local_5810;
  size_t local_5808;
  ulong local_5800 [560];
  undefined1 local_4680 [32];
  uint local_4660;
  uint uStack_465c;
  uint uStack_4658;
  uint uStack_4654;
  uint uStack_4650;
  uint uStack_464c;
  uint uStack_4648;
  uint uStack_4644;
  undefined1 local_4640 [17936];
  undefined1 auVar57 [32];
  
  local_5a80 = (BVH *)This->ptr;
  if ((local_5a80->root).ptr != 8) {
    if ((context->user == (RTCRayQueryContext *)0x0) ||
       ((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) == RTC_RAY_QUERY_FLAG_INCOHERENT)) {
      auVar33 = vpcmpeqd_avx2(in_ZMM2._0_32_,in_ZMM2._0_32_);
      auVar32 = ZEXT816(0) << 0x40;
      uVar31 = vcmpps_avx512vl(*(undefined1 (*) [32])(ray + 0x100),ZEXT1632(auVar32),5);
      uVar26 = vpcmpeqd_avx512vl(auVar33,(undefined1  [32])valid_i->field_0);
      uVar31 = uVar31 & uVar26;
      bVar17 = (byte)uVar31;
      if (bVar17 != 0) {
        local_5a40._0_4_ = *(undefined4 *)ray;
        local_5a40._4_4_ = *(undefined4 *)(ray + 4);
        local_5a40._8_4_ = *(undefined4 *)(ray + 8);
        local_5a40._12_4_ = *(undefined4 *)(ray + 0xc);
        local_5a40._16_4_ = *(undefined4 *)(ray + 0x10);
        local_5a40._20_4_ = *(undefined4 *)(ray + 0x14);
        local_5a40._24_4_ = *(undefined4 *)(ray + 0x18);
        local_5a40._28_4_ = *(undefined4 *)(ray + 0x1c);
        local_5a40._32_4_ = *(undefined4 *)(ray + 0x20);
        local_5a40._36_4_ = *(undefined4 *)(ray + 0x24);
        local_5a40._40_4_ = *(undefined4 *)(ray + 0x28);
        local_5a40._44_4_ = *(undefined4 *)(ray + 0x2c);
        local_5a40._48_4_ = *(undefined4 *)(ray + 0x30);
        local_5a40._52_4_ = *(undefined4 *)(ray + 0x34);
        local_5a40._56_4_ = *(undefined4 *)(ray + 0x38);
        local_5a40._60_4_ = *(undefined4 *)(ray + 0x3c);
        local_5a40._64_4_ = *(undefined4 *)(ray + 0x40);
        local_5a40._68_4_ = *(undefined4 *)(ray + 0x44);
        local_5a40._72_4_ = *(undefined4 *)(ray + 0x48);
        local_5a40._76_4_ = *(undefined4 *)(ray + 0x4c);
        local_5a40._80_4_ = *(undefined4 *)(ray + 0x50);
        local_5a40._84_4_ = *(undefined4 *)(ray + 0x54);
        local_5a40._88_4_ = *(undefined4 *)(ray + 0x58);
        local_5a40._92_4_ = *(undefined4 *)(ray + 0x5c);
        local_59e0 = *(undefined1 (*) [32])(ray + 0x80);
        local_59c0 = *(undefined1 (*) [32])(ray + 0xa0);
        local_59a0 = *(undefined1 (*) [32])(ray + 0xc0);
        auVar33 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
        auVar58 = ZEXT3264(auVar33);
        vandps_avx512vl(local_59e0,auVar33);
        auVar34._8_4_ = 0x219392ef;
        auVar34._0_8_ = 0x219392ef219392ef;
        auVar34._12_4_ = 0x219392ef;
        auVar34._16_4_ = 0x219392ef;
        auVar34._20_4_ = 0x219392ef;
        auVar34._24_4_ = 0x219392ef;
        auVar34._28_4_ = 0x219392ef;
        uVar26 = vcmpps_avx512vl(auVar33,auVar34,1);
        bVar30 = (bool)((byte)uVar26 & 1);
        auVar35._0_4_ = (uint)bVar30 * 0x219392ef | (uint)!bVar30 * local_59e0._0_4_;
        bVar30 = (bool)((byte)(uVar26 >> 1) & 1);
        auVar35._4_4_ = (uint)bVar30 * 0x219392ef | (uint)!bVar30 * local_59e0._4_4_;
        bVar30 = (bool)((byte)(uVar26 >> 2) & 1);
        auVar35._8_4_ = (uint)bVar30 * 0x219392ef | (uint)!bVar30 * local_59e0._8_4_;
        bVar30 = (bool)((byte)(uVar26 >> 3) & 1);
        auVar35._12_4_ = (uint)bVar30 * 0x219392ef | (uint)!bVar30 * local_59e0._12_4_;
        bVar30 = (bool)((byte)(uVar26 >> 4) & 1);
        auVar35._16_4_ = (uint)bVar30 * 0x219392ef | (uint)!bVar30 * local_59e0._16_4_;
        bVar30 = (bool)((byte)(uVar26 >> 5) & 1);
        auVar35._20_4_ = (uint)bVar30 * 0x219392ef | (uint)!bVar30 * local_59e0._20_4_;
        bVar30 = (bool)((byte)(uVar26 >> 6) & 1);
        auVar35._24_4_ = (uint)bVar30 * 0x219392ef | (uint)!bVar30 * local_59e0._24_4_;
        bVar30 = SUB81(uVar26 >> 7,0);
        auVar35._28_4_ = (uint)bVar30 * 0x219392ef | (uint)!bVar30 * local_59e0._28_4_;
        vandps_avx512vl(local_59c0,auVar33);
        uVar26 = vcmpps_avx512vl(auVar35,auVar34,1);
        bVar30 = (bool)((byte)uVar26 & 1);
        auVar36._0_4_ = (uint)bVar30 * 0x219392ef | (uint)!bVar30 * local_59c0._0_4_;
        bVar30 = (bool)((byte)(uVar26 >> 1) & 1);
        auVar36._4_4_ = (uint)bVar30 * 0x219392ef | (uint)!bVar30 * local_59c0._4_4_;
        bVar30 = (bool)((byte)(uVar26 >> 2) & 1);
        auVar36._8_4_ = (uint)bVar30 * 0x219392ef | (uint)!bVar30 * local_59c0._8_4_;
        bVar30 = (bool)((byte)(uVar26 >> 3) & 1);
        auVar36._12_4_ = (uint)bVar30 * 0x219392ef | (uint)!bVar30 * local_59c0._12_4_;
        bVar30 = (bool)((byte)(uVar26 >> 4) & 1);
        auVar36._16_4_ = (uint)bVar30 * 0x219392ef | (uint)!bVar30 * local_59c0._16_4_;
        bVar30 = (bool)((byte)(uVar26 >> 5) & 1);
        auVar36._20_4_ = (uint)bVar30 * 0x219392ef | (uint)!bVar30 * local_59c0._20_4_;
        bVar30 = (bool)((byte)(uVar26 >> 6) & 1);
        auVar36._24_4_ = (uint)bVar30 * 0x219392ef | (uint)!bVar30 * local_59c0._24_4_;
        bVar30 = SUB81(uVar26 >> 7,0);
        auVar36._28_4_ = (uint)bVar30 * 0x219392ef | (uint)!bVar30 * local_59c0._28_4_;
        vandps_avx512vl(local_59a0,auVar33);
        uVar26 = vcmpps_avx512vl(auVar36,auVar34,1);
        bVar30 = (bool)((byte)uVar26 & 1);
        auVar33._0_4_ = (uint)bVar30 * 0x219392ef | (uint)!bVar30 * local_59a0._0_4_;
        bVar30 = (bool)((byte)(uVar26 >> 1) & 1);
        auVar33._4_4_ = (uint)bVar30 * 0x219392ef | (uint)!bVar30 * local_59a0._4_4_;
        bVar30 = (bool)((byte)(uVar26 >> 2) & 1);
        auVar33._8_4_ = (uint)bVar30 * 0x219392ef | (uint)!bVar30 * local_59a0._8_4_;
        bVar30 = (bool)((byte)(uVar26 >> 3) & 1);
        auVar33._12_4_ = (uint)bVar30 * 0x219392ef | (uint)!bVar30 * local_59a0._12_4_;
        bVar30 = (bool)((byte)(uVar26 >> 4) & 1);
        auVar33._16_4_ = (uint)bVar30 * 0x219392ef | (uint)!bVar30 * local_59a0._16_4_;
        bVar30 = (bool)((byte)(uVar26 >> 5) & 1);
        auVar33._20_4_ = (uint)bVar30 * 0x219392ef | (uint)!bVar30 * local_59a0._20_4_;
        bVar30 = (bool)((byte)(uVar26 >> 6) & 1);
        auVar33._24_4_ = (uint)bVar30 * 0x219392ef | (uint)!bVar30 * local_59a0._24_4_;
        bVar30 = SUB81(uVar26 >> 7,0);
        auVar33._28_4_ = (uint)bVar30 * 0x219392ef | (uint)!bVar30 * local_59a0._28_4_;
        auVar37._8_4_ = 0x3f800000;
        auVar37._0_8_ = &DAT_3f8000003f800000;
        auVar37._12_4_ = 0x3f800000;
        auVar37._16_4_ = 0x3f800000;
        auVar37._20_4_ = 0x3f800000;
        auVar37._24_4_ = 0x3f800000;
        auVar37._28_4_ = 0x3f800000;
        auVar34 = vrcp14ps_avx512vl(auVar35);
        auVar56 = vfnmadd213ps_fma(auVar35,auVar34,auVar37);
        auVar56 = vfmadd132ps_fma(ZEXT1632(auVar56),auVar34,auVar34);
        auVar35 = vrcp14ps_avx512vl(auVar36);
        auVar12 = vfnmadd213ps_fma(auVar36,auVar35,auVar37);
        auVar12 = vfmadd132ps_fma(ZEXT1632(auVar12),auVar35,auVar35);
        auVar35 = vrcp14ps_avx512vl(auVar33);
        auVar13 = vfnmadd213ps_fma(auVar33,auVar35,auVar37);
        local_5980 = ZEXT1632(auVar56);
        local_5960 = ZEXT1632(auVar12);
        auVar13 = vfmadd132ps_fma(ZEXT1632(auVar13),auVar35,auVar35);
        local_5940 = ZEXT1632(auVar13);
        local_5920 = (float)local_5a40._0_4_ * auVar56._0_4_;
        fStack_591c = (float)local_5a40._4_4_ * auVar56._4_4_;
        fStack_5918 = (float)local_5a40._8_4_ * auVar56._8_4_;
        fStack_5914 = (float)local_5a40._12_4_ * auVar56._12_4_;
        fStack_5910 = (float)local_5a40._16_4_ * 0.0;
        fStack_590c = (float)local_5a40._20_4_ * 0.0;
        fStack_5908 = (float)local_5a40._24_4_ * 0.0;
        local_5900 = (float)local_5a40._32_4_ * auVar12._0_4_;
        fStack_58fc = (float)local_5a40._36_4_ * auVar12._4_4_;
        fStack_58f8 = (float)local_5a40._40_4_ * auVar12._8_4_;
        fStack_58f4 = (float)local_5a40._44_4_ * auVar12._12_4_;
        fStack_58f0 = (float)local_5a40._48_4_ * 0.0;
        fStack_58ec = (float)local_5a40._52_4_ * 0.0;
        fStack_58e8 = (float)local_5a40._56_4_ * 0.0;
        local_58e0._4_4_ = (float)local_5a40._68_4_ * auVar13._4_4_;
        local_58e0._0_4_ = (float)local_5a40._64_4_ * auVar13._0_4_;
        local_58e0._8_4_ = (float)local_5a40._72_4_ * auVar13._8_4_;
        local_58e0._12_4_ = (float)local_5a40._76_4_ * auVar13._12_4_;
        local_58e0._16_4_ = (float)local_5a40._80_4_ * 0.0;
        local_58e0._20_4_ = (float)local_5a40._84_4_ * 0.0;
        local_58e0._24_4_ = (float)local_5a40._88_4_ * 0.0;
        local_58e0._28_4_ = local_5a40._92_4_;
        uVar26 = vcmpps_avx512vl(ZEXT1632(auVar56),ZEXT1632(auVar32),1);
        auVar33 = vpbroadcastd_avx512vl(ZEXT416(0x20));
        local_58c0 = (uint)((byte)uVar26 & 1) * auVar33._0_4_;
        iStack_58bc = (uint)((byte)(uVar26 >> 1) & 1) * auVar33._4_4_;
        iStack_58b8 = (uint)((byte)(uVar26 >> 2) & 1) * auVar33._8_4_;
        iStack_58b4 = (uint)((byte)(uVar26 >> 3) & 1) * auVar33._12_4_;
        iStack_58b0 = (uint)((byte)(uVar26 >> 4) & 1) * auVar33._16_4_;
        iStack_58ac = (uint)((byte)(uVar26 >> 5) & 1) * auVar33._20_4_;
        iStack_58a8 = (uint)((byte)(uVar26 >> 6) & 1) * auVar33._24_4_;
        iStack_58a4 = (uint)(byte)(uVar26 >> 7) * auVar33._28_4_;
        auVar35 = ZEXT1632(auVar32);
        uVar26 = vcmpps_avx512vl(ZEXT1632(auVar12),auVar35,5);
        auVar33 = vpbroadcastd_avx512vl(ZEXT416(0x40));
        bVar30 = (bool)((byte)uVar26 & 1);
        local_58a0 = (uint)bVar30 * auVar33._0_4_ | (uint)!bVar30 * 0x60;
        bVar30 = (bool)((byte)(uVar26 >> 1) & 1);
        uStack_589c = (uint)bVar30 * auVar33._4_4_ | (uint)!bVar30 * 0x60;
        bVar30 = (bool)((byte)(uVar26 >> 2) & 1);
        uStack_5898 = (uint)bVar30 * auVar33._8_4_ | (uint)!bVar30 * 0x60;
        bVar30 = (bool)((byte)(uVar26 >> 3) & 1);
        uStack_5894 = (uint)bVar30 * auVar33._12_4_ | (uint)!bVar30 * 0x60;
        bVar30 = (bool)((byte)(uVar26 >> 4) & 1);
        uStack_5890 = (uint)bVar30 * auVar33._16_4_ | (uint)!bVar30 * 0x60;
        bVar30 = (bool)((byte)(uVar26 >> 5) & 1);
        uStack_588c = (uint)bVar30 * auVar33._20_4_ | (uint)!bVar30 * 0x60;
        bVar30 = (bool)((byte)(uVar26 >> 6) & 1);
        uStack_5888 = (uint)bVar30 * auVar33._24_4_ | (uint)!bVar30 * 0x60;
        bVar30 = SUB81(uVar26 >> 7,0);
        uStack_5884 = (uint)bVar30 * auVar33._28_4_ | (uint)!bVar30 * 0x60;
        uVar26 = vcmpps_avx512vl(ZEXT1632(auVar13),auVar35,5);
        auVar33 = vpbroadcastd_avx512vl(ZEXT416(0x80));
        bVar30 = (bool)((byte)uVar26 & 1);
        local_5880 = (uint)bVar30 * auVar33._0_4_ | (uint)!bVar30 * 0xa0;
        bVar30 = (bool)((byte)(uVar26 >> 1) & 1);
        uStack_587c = (uint)bVar30 * auVar33._4_4_ | (uint)!bVar30 * 0xa0;
        bVar30 = (bool)((byte)(uVar26 >> 2) & 1);
        uStack_5878 = (uint)bVar30 * auVar33._8_4_ | (uint)!bVar30 * 0xa0;
        bVar30 = (bool)((byte)(uVar26 >> 3) & 1);
        uStack_5874 = (uint)bVar30 * auVar33._12_4_ | (uint)!bVar30 * 0xa0;
        bVar30 = (bool)((byte)(uVar26 >> 4) & 1);
        uStack_5870 = (uint)bVar30 * auVar33._16_4_ | (uint)!bVar30 * 0xa0;
        bVar30 = (bool)((byte)(uVar26 >> 5) & 1);
        uStack_586c = (uint)bVar30 * auVar33._20_4_ | (uint)!bVar30 * 0xa0;
        bVar30 = (bool)((byte)(uVar26 >> 6) & 1);
        uStack_5868 = (uint)bVar30 * auVar33._24_4_ | (uint)!bVar30 * 0xa0;
        bVar30 = SUB81(uVar26 >> 7,0);
        uStack_5864 = (uint)bVar30 * auVar33._28_4_ | (uint)!bVar30 * 0xa0;
        local_4680 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
        auVar60 = ZEXT3264(local_4680);
        auVar33 = vmaxps_avx512vl(*(undefined1 (*) [32])(ray + 0x60),auVar35);
        local_5860 = (uint)(bVar17 & 1) * auVar33._0_4_ |
                     (uint)!(bool)(bVar17 & 1) * local_4680._0_4_;
        bVar30 = (bool)((byte)(uVar31 >> 1) & 1);
        uStack_585c = (uint)bVar30 * auVar33._4_4_ | (uint)!bVar30 * local_4680._4_4_;
        bVar30 = (bool)((byte)(uVar31 >> 2) & 1);
        uStack_5858 = (uint)bVar30 * auVar33._8_4_ | (uint)!bVar30 * local_4680._8_4_;
        bVar30 = (bool)((byte)(uVar31 >> 3) & 1);
        uStack_5854 = (uint)bVar30 * auVar33._12_4_ | (uint)!bVar30 * local_4680._12_4_;
        bVar30 = (bool)((byte)(uVar31 >> 4) & 1);
        uStack_5850 = (uint)bVar30 * auVar33._16_4_ | (uint)!bVar30 * local_4680._16_4_;
        bVar30 = (bool)((byte)(uVar31 >> 5) & 1);
        uStack_584c = (uint)bVar30 * auVar33._20_4_ | (uint)!bVar30 * local_4680._20_4_;
        bVar30 = (bool)((byte)(uVar31 >> 6) & 1);
        uStack_5848 = (uint)bVar30 * auVar33._24_4_ | (uint)!bVar30 * local_4680._24_4_;
        bVar30 = SUB81(uVar31 >> 7,0);
        uStack_5844 = (uint)bVar30 * auVar33._28_4_ | (uint)!bVar30 * local_4680._28_4_;
        auVar33 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
        auVar59 = ZEXT3264(auVar33);
        local_5a8c = (undefined4)uVar31;
        auVar35 = vmaxps_avx512vl(*(undefined1 (*) [32])(ray + 0x100),auVar35);
        local_5840 = (uint)(bVar17 & 1) * auVar35._0_4_ | (uint)!(bool)(bVar17 & 1) * auVar33._0_4_;
        bVar30 = (bool)((byte)(uVar31 >> 1) & 1);
        uStack_583c = (uint)bVar30 * auVar35._4_4_ | (uint)!bVar30 * auVar33._4_4_;
        bVar30 = (bool)((byte)(uVar31 >> 2) & 1);
        uStack_5838 = (uint)bVar30 * auVar35._8_4_ | (uint)!bVar30 * auVar33._8_4_;
        bVar30 = (bool)((byte)(uVar31 >> 3) & 1);
        uStack_5834 = (uint)bVar30 * auVar35._12_4_ | (uint)!bVar30 * auVar33._12_4_;
        bVar30 = (bool)((byte)(uVar31 >> 4) & 1);
        uStack_5830 = (uint)bVar30 * auVar35._16_4_ | (uint)!bVar30 * auVar33._16_4_;
        bVar30 = (bool)((byte)(uVar31 >> 5) & 1);
        uStack_582c = (uint)bVar30 * auVar35._20_4_ | (uint)!bVar30 * auVar33._20_4_;
        bVar30 = (bool)((byte)(uVar31 >> 6) & 1);
        uStack_5828 = (uint)bVar30 * auVar35._24_4_ | (uint)!bVar30 * auVar33._24_4_;
        bVar30 = SUB81(uVar31 >> 7,0);
        uStack_5824 = (uint)bVar30 * auVar35._28_4_ | (uint)!bVar30 * auVar33._28_4_;
        bVar17 = ~bVar17;
        if (context->user == (RTCRayQueryContext *)0x0) {
          uVar31 = 7;
        }
        else {
          uVar31 = (ulong)((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) ==
                          RTC_RAY_QUERY_FLAG_INCOHERENT) * 5 + 2;
        }
        local_5a68 = ray + 0x100;
        puVar29 = local_5800;
        local_5810 = 0xfffffffffffffff8;
        pauVar28 = (undefined1 (*) [32])local_4640;
        local_5808 = (local_5a80->root).ptr;
        local_4660 = local_5860;
        uStack_465c = uStack_585c;
        uStack_4658 = uStack_5858;
        uStack_4654 = uStack_5854;
        uStack_4650 = uStack_5850;
        uStack_464c = uStack_584c;
        uStack_4648 = uStack_5848;
        uStack_4644 = uStack_5844;
        auVar33 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
        auVar61 = ZEXT3264(auVar33);
        auVar32 = vxorps_avx512vl(in_ZMM31._0_16_,in_ZMM31._0_16_);
        auVar62 = ZEXT1664(auVar32);
        local_5a88 = ray;
        local_5a98 = This;
        local_5a78 = context;
        local_5aa0 = uVar31;
        uStack_5904 = local_5a40._28_4_;
        uStack_58e4 = local_5a40._60_4_;
LAB_00871f81:
        pauVar28 = pauVar28 + -1;
        root.ptr = puVar29[-1];
        puVar29 = puVar29 + -1;
        if (root.ptr == 0xfffffffffffffff8) {
          iVar18 = 3;
        }
        else {
          local_5a60 = *pauVar28;
          auVar51._4_4_ = uStack_583c;
          auVar51._0_4_ = local_5840;
          auVar51._8_4_ = uStack_5838;
          auVar51._12_4_ = uStack_5834;
          auVar51._16_4_ = uStack_5830;
          auVar51._20_4_ = uStack_582c;
          auVar51._24_4_ = uStack_5828;
          auVar51._28_4_ = uStack_5824;
          uVar26 = vcmpps_avx512vl(local_5a60,auVar51,1);
          if ((char)uVar26 == '\0') {
            iVar18 = 2;
          }
          else {
            uVar25 = (undefined4)uVar26;
            iVar18 = 0;
            if ((uint)POPCOUNT(uVar25) <= uVar31) {
              do {
                local_5a70 = 0;
                for (uVar31 = uVar26; (uVar31 & 1) == 0; uVar31 = uVar31 >> 1 | 0x8000000000000000)
                {
                  local_5a70 = local_5a70 + 1;
                }
                bVar30 = occluded1(local_5a98,local_5a80,root,local_5a70,&local_5aa1,local_5a88,
                                   (TravRayK<8,_false> *)&local_5a40.field_0,local_5a78);
                bVar19 = (byte)(1 << ((uint)local_5a70 & 0x1f));
                if (!bVar30) {
                  bVar19 = 0;
                }
                bVar17 = bVar17 | bVar19;
                uVar26 = uVar26 - 1 & uVar26;
              } while (uVar26 != 0);
              if (bVar17 == 0xff) {
                iVar18 = 3;
              }
              else {
                auVar33 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                local_5840 = (uint)(bVar17 & 1) * auVar33._0_4_ | !(bool)(bVar17 & 1) * local_5840;
                bVar30 = (bool)(bVar17 >> 1 & 1);
                uStack_583c = (uint)bVar30 * auVar33._4_4_ | !bVar30 * uStack_583c;
                bVar30 = (bool)(bVar17 >> 2 & 1);
                uStack_5838 = (uint)bVar30 * auVar33._8_4_ | !bVar30 * uStack_5838;
                bVar30 = (bool)(bVar17 >> 3 & 1);
                uStack_5834 = (uint)bVar30 * auVar33._12_4_ | !bVar30 * uStack_5834;
                bVar30 = (bool)(bVar17 >> 4 & 1);
                uStack_5830 = (uint)bVar30 * auVar33._16_4_ | !bVar30 * uStack_5830;
                bVar30 = (bool)(bVar17 >> 5 & 1);
                uStack_582c = (uint)bVar30 * auVar33._20_4_ | !bVar30 * uStack_582c;
                bVar30 = (bool)(bVar17 >> 6 & 1);
                uStack_5828 = (uint)bVar30 * auVar33._24_4_ | !bVar30 * uStack_5828;
                uStack_5824 = (uint)(bVar17 >> 7) * auVar33._28_4_ |
                              !(bool)(bVar17 >> 7) * uStack_5824;
                iVar18 = 2;
              }
              auVar33 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
              auVar58 = ZEXT3264(auVar33);
              auVar33 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
              auVar59 = ZEXT3264(auVar33);
              auVar33 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
              auVar60 = ZEXT3264(auVar33);
              auVar33 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
              auVar61 = ZEXT3264(auVar33);
              auVar32 = vxorps_avx512vl(auVar62._0_16_,auVar62._0_16_);
              auVar62 = ZEXT1664(auVar32);
            }
            auVar55 = ZEXT3264(local_5a60);
            uVar31 = local_5aa0;
            if ((uint)local_5aa0 < (uint)POPCOUNT(uVar25)) {
              do {
                if ((root.ptr & 8) != 0) {
                  if (root.ptr == 0xfffffffffffffff8) goto LAB_0087242a;
                  auVar9._4_4_ = uStack_583c;
                  auVar9._0_4_ = local_5840;
                  auVar9._8_4_ = uStack_5838;
                  auVar9._12_4_ = uStack_5834;
                  auVar9._16_4_ = uStack_5830;
                  auVar9._20_4_ = uStack_582c;
                  auVar9._24_4_ = uStack_5828;
                  auVar9._28_4_ = uStack_5824;
                  uVar10 = vcmpps_avx512vl(auVar9,auVar55._0_32_,6);
                  if ((char)uVar10 != '\0') {
                    uVar26 = (ulong)((uint)root.ptr & 0xf);
                    bVar19 = bVar17;
                    if (uVar26 == 8) goto LAB_00872402;
                    bVar19 = ~bVar17;
                    auVar33 = *(undefined1 (*) [32])(local_5a88 + 0x60);
                    auVar35 = *(undefined1 (*) [32])(local_5a88 + 0xa0);
                    auVar36 = *(undefined1 (*) [32])(local_5a88 + 0xc0);
                    auVar34 = *(undefined1 (*) [32])(local_5a88 + 0x80);
                    auVar37 = *(undefined1 (*) [32])(local_5a88 + 0x100);
                    lVar27 = (root.ptr & 0xfffffffffffffff0) + 0x90;
                    uVar20 = 0;
                    goto LAB_008721e0;
                  }
                  iVar18 = 2;
                  break;
                }
                auVar55 = ZEXT3264(auVar60._0_32_);
                uVar26 = 0;
                uVar20 = 8;
                do {
                  uVar22 = *(ulong *)((root.ptr & 0xfffffffffffffff0) + uVar26 * 8);
                  if (uVar22 != 8) {
                    auVar48._4_4_ = fStack_591c;
                    auVar48._0_4_ = local_5920;
                    auVar48._8_4_ = fStack_5918;
                    auVar48._12_4_ = fStack_5914;
                    auVar48._16_4_ = fStack_5910;
                    auVar48._20_4_ = fStack_590c;
                    auVar48._24_4_ = fStack_5908;
                    auVar48._28_4_ = uStack_5904;
                    uVar25 = *(undefined4 *)(root.ptr + 0x40 + uVar26 * 4);
                    auVar52._4_4_ = uVar25;
                    auVar52._0_4_ = uVar25;
                    auVar52._8_4_ = uVar25;
                    auVar52._12_4_ = uVar25;
                    auVar52._16_4_ = uVar25;
                    auVar52._20_4_ = uVar25;
                    auVar52._24_4_ = uVar25;
                    auVar52._28_4_ = uVar25;
                    auVar32 = vfmsub132ps_fma(auVar52,auVar48,local_5980);
                    auVar49._4_4_ = fStack_58fc;
                    auVar49._0_4_ = local_5900;
                    auVar49._8_4_ = fStack_58f8;
                    auVar49._12_4_ = fStack_58f4;
                    auVar49._16_4_ = fStack_58f0;
                    auVar49._20_4_ = fStack_58ec;
                    auVar49._24_4_ = fStack_58e8;
                    auVar49._28_4_ = uStack_58e4;
                    uVar25 = *(undefined4 *)(root.ptr + 0x80 + uVar26 * 4);
                    auVar53._4_4_ = uVar25;
                    auVar53._0_4_ = uVar25;
                    auVar53._8_4_ = uVar25;
                    auVar53._12_4_ = uVar25;
                    auVar53._16_4_ = uVar25;
                    auVar53._20_4_ = uVar25;
                    auVar53._24_4_ = uVar25;
                    auVar53._28_4_ = uVar25;
                    uVar25 = *(undefined4 *)(root.ptr + 0xc0 + uVar26 * 4);
                    auVar54._4_4_ = uVar25;
                    auVar54._0_4_ = uVar25;
                    auVar54._8_4_ = uVar25;
                    auVar54._12_4_ = uVar25;
                    auVar54._16_4_ = uVar25;
                    auVar54._20_4_ = uVar25;
                    auVar54._24_4_ = uVar25;
                    auVar54._28_4_ = uVar25;
                    auVar56 = vfmsub132ps_fma(auVar53,auVar49,local_5960);
                    auVar12 = vfmsub132ps_fma(auVar54,local_58e0,local_5940);
                    uVar25 = *(undefined4 *)(root.ptr + 0x60 + uVar26 * 4);
                    auVar45._4_4_ = uVar25;
                    auVar45._0_4_ = uVar25;
                    auVar45._8_4_ = uVar25;
                    auVar45._12_4_ = uVar25;
                    auVar45._16_4_ = uVar25;
                    auVar45._20_4_ = uVar25;
                    auVar45._24_4_ = uVar25;
                    auVar45._28_4_ = uVar25;
                    auVar36 = vfmsub132ps_avx512vl(local_5980,auVar48,auVar45);
                    uVar25 = *(undefined4 *)(root.ptr + 0xa0 + uVar26 * 4);
                    auVar46._4_4_ = uVar25;
                    auVar46._0_4_ = uVar25;
                    auVar46._8_4_ = uVar25;
                    auVar46._12_4_ = uVar25;
                    auVar46._16_4_ = uVar25;
                    auVar46._20_4_ = uVar25;
                    auVar46._24_4_ = uVar25;
                    auVar46._28_4_ = uVar25;
                    auVar34 = vfmsub132ps_avx512vl(local_5960,auVar49,auVar46);
                    uVar25 = *(undefined4 *)(root.ptr + 0xe0 + uVar26 * 4);
                    auVar47._4_4_ = uVar25;
                    auVar47._0_4_ = uVar25;
                    auVar47._8_4_ = uVar25;
                    auVar47._12_4_ = uVar25;
                    auVar47._16_4_ = uVar25;
                    auVar47._20_4_ = uVar25;
                    auVar47._24_4_ = uVar25;
                    auVar47._28_4_ = uVar25;
                    auVar37 = vfmsub132ps_avx512vl(local_5940,local_58e0,auVar47);
                    auVar33 = vpminsd_avx2(ZEXT1632(auVar32),auVar36);
                    auVar35 = vpminsd_avx2(ZEXT1632(auVar56),auVar34);
                    auVar33 = vpmaxsd_avx2(auVar33,auVar35);
                    auVar35 = vpminsd_avx2(ZEXT1632(auVar12),auVar37);
                    auVar33 = vpmaxsd_avx2(auVar33,auVar35);
                    auVar35 = vpmaxsd_avx2(ZEXT1632(auVar32),auVar36);
                    auVar36 = vpmaxsd_avx2(ZEXT1632(auVar56),auVar34);
                    auVar36 = vpminsd_avx2(auVar35,auVar36);
                    auVar35 = vpmaxsd_avx2(ZEXT1632(auVar12),auVar37);
                    auVar36 = vpminsd_avx2(auVar36,auVar35);
                    auVar14._4_4_ = uStack_585c;
                    auVar14._0_4_ = local_5860;
                    auVar14._8_4_ = uStack_5858;
                    auVar14._12_4_ = uStack_5854;
                    auVar14._16_4_ = uStack_5850;
                    auVar14._20_4_ = uStack_584c;
                    auVar14._24_4_ = uStack_5848;
                    auVar14._28_4_ = uStack_5844;
                    auVar35 = vpmaxsd_avx2(auVar33,auVar14);
                    auVar15._4_4_ = uStack_583c;
                    auVar15._0_4_ = local_5840;
                    auVar15._8_4_ = uStack_5838;
                    auVar15._12_4_ = uStack_5834;
                    auVar15._16_4_ = uStack_5830;
                    auVar15._20_4_ = uStack_582c;
                    auVar15._24_4_ = uStack_5828;
                    auVar15._28_4_ = uStack_5824;
                    auVar36 = vpminsd_avx2(auVar36,auVar15);
                    uVar23 = vpcmpd_avx512vl(auVar35,auVar36,2);
                    if ((byte)uVar23 != 0) {
                      auVar35 = vblendmps_avx512vl(auVar60._0_32_,auVar33);
                      bVar30 = (bool)((byte)uVar23 & 1);
                      bVar2 = (bool)((byte)(uVar23 >> 1) & 1);
                      bVar3 = (bool)((byte)(uVar23 >> 2) & 1);
                      bVar4 = (bool)((byte)(uVar23 >> 3) & 1);
                      bVar5 = (bool)((byte)(uVar23 >> 4) & 1);
                      bVar6 = (bool)((byte)(uVar23 >> 5) & 1);
                      bVar7 = (bool)((byte)(uVar23 >> 6) & 1);
                      bVar8 = SUB81(uVar23 >> 7,0);
                      if (uVar20 != 8) {
                        *puVar29 = uVar20;
                        puVar29 = puVar29 + 1;
                        *pauVar28 = auVar55._0_32_;
                        pauVar28 = pauVar28 + 1;
                      }
                      auVar55 = ZEXT3264(CONCAT428((uint)bVar8 * auVar35._28_4_ |
                                                   (uint)!bVar8 * auVar33._28_4_,
                                                   CONCAT424((uint)bVar7 * auVar35._24_4_ |
                                                             (uint)!bVar7 * auVar33._24_4_,
                                                             CONCAT420((uint)bVar6 * auVar35._20_4_
                                                                       | (uint)!bVar6 *
                                                                         auVar33._20_4_,
                                                                       CONCAT416((uint)bVar5 *
                                                                                 auVar35._16_4_ |
                                                                                 (uint)!bVar5 *
                                                                                 auVar33._16_4_,
                                                                                 CONCAT412((uint)
                                                  bVar4 * auVar35._12_4_ |
                                                  (uint)!bVar4 * auVar33._12_4_,
                                                  CONCAT48((uint)bVar3 * auVar35._8_4_ |
                                                           (uint)!bVar3 * auVar33._8_4_,
                                                           CONCAT44((uint)bVar2 * auVar35._4_4_ |
                                                                    (uint)!bVar2 * auVar33._4_4_,
                                                                    (uint)bVar30 * auVar35._0_4_ |
                                                                    (uint)!bVar30 * auVar33._0_4_)))
                                                  )))));
                      uVar20 = uVar22;
                    }
                  }
                } while ((uVar22 != 8) && (bVar30 = uVar26 < 7, uVar26 = uVar26 + 1, bVar30));
                iVar18 = 0;
                if (uVar20 == 8) {
LAB_0087214b:
                  bVar30 = false;
                  iVar18 = 4;
                }
                else {
                  auVar16._4_4_ = uStack_583c;
                  auVar16._0_4_ = local_5840;
                  auVar16._8_4_ = uStack_5838;
                  auVar16._12_4_ = uStack_5834;
                  auVar16._16_4_ = uStack_5830;
                  auVar16._20_4_ = uStack_582c;
                  auVar16._24_4_ = uStack_5828;
                  auVar16._28_4_ = uStack_5824;
                  uVar10 = vcmpps_avx512vl(auVar55._0_32_,auVar16,9);
                  bVar30 = true;
                  if ((uint)POPCOUNT((int)uVar10) <= (uint)local_5aa0) {
                    *puVar29 = uVar20;
                    puVar29 = puVar29 + 1;
                    *pauVar28 = auVar55._0_32_;
                    pauVar28 = pauVar28 + 1;
                    goto LAB_0087214b;
                  }
                }
                root.ptr = uVar20;
              } while (bVar30);
            }
          }
        }
        goto LAB_00872430;
      }
    }
    else {
      occludedCoherent(valid_i,This,ray,context);
    }
  }
  return;
  while( true ) {
    uVar20 = uVar20 + 1;
    lVar27 = lVar27 + 0xb0;
    if (uVar26 - 8 <= uVar20) break;
LAB_008721e0:
    uVar22 = 0;
    bVar21 = bVar19;
    while (uVar23 = (ulong)*(uint *)(lVar27 + uVar22 * 4), uVar23 != 0xffffffff) {
      uVar25 = *(undefined4 *)(lVar27 + -0x90 + uVar22 * 4);
      auVar50._4_4_ = uVar25;
      auVar50._0_4_ = uVar25;
      auVar50._8_4_ = uVar25;
      auVar50._12_4_ = uVar25;
      auVar50._16_4_ = uVar25;
      auVar50._20_4_ = uVar25;
      auVar50._24_4_ = uVar25;
      auVar50._28_4_ = uVar25;
      uVar25 = *(undefined4 *)(lVar27 + -0x80 + uVar22 * 4);
      auVar38._4_4_ = uVar25;
      auVar38._0_4_ = uVar25;
      auVar38._8_4_ = uVar25;
      auVar38._12_4_ = uVar25;
      auVar38._16_4_ = uVar25;
      auVar38._20_4_ = uVar25;
      auVar38._24_4_ = uVar25;
      auVar38._28_4_ = uVar25;
      auVar51 = vsubps_avx(auVar50,*(undefined1 (*) [32])local_5a88);
      auVar9 = vsubps_avx(auVar38,*(undefined1 (*) [32])(local_5a88 + 0x20));
      uVar25 = *(undefined4 *)(lVar27 + -0x70 + uVar22 * 4);
      auVar41._4_4_ = uVar25;
      auVar41._0_4_ = uVar25;
      auVar41._8_4_ = uVar25;
      auVar41._12_4_ = uVar25;
      auVar41._16_4_ = uVar25;
      auVar41._20_4_ = uVar25;
      auVar41._24_4_ = uVar25;
      auVar41._28_4_ = uVar25;
      uVar25 = *(undefined4 *)(lVar27 + -0x60 + uVar22 * 4);
      auVar56._4_4_ = uVar25;
      auVar56._0_4_ = uVar25;
      auVar56._8_4_ = uVar25;
      auVar56._12_4_ = uVar25;
      auVar57._16_4_ = uVar25;
      auVar57._0_16_ = auVar56;
      auVar57._20_4_ = uVar25;
      auVar57._24_4_ = uVar25;
      auVar57._28_4_ = uVar25;
      auVar38 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(lVar27 + -0x50 + uVar22 * 4)));
      auVar39 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(lVar27 + -0x40 + uVar22 * 4)));
      auVar40 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(lVar27 + -0x30 + uVar22 * 4)));
      auVar50 = vsubps_avx(auVar41,*(undefined1 (*) [32])(local_5a88 + 0x40));
      auVar41 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(lVar27 + -0x20 + uVar22 * 4)));
      auVar42 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(lVar27 + -0x10 + uVar22 * 4)));
      auVar32 = vmulss_avx512f(auVar38._0_16_,auVar42._0_16_);
      auVar43._0_4_ = auVar32._0_4_;
      auVar43._4_4_ = auVar43._0_4_;
      auVar43._8_4_ = auVar43._0_4_;
      auVar43._12_4_ = auVar43._0_4_;
      auVar43._16_4_ = auVar43._0_4_;
      auVar43._20_4_ = auVar43._0_4_;
      auVar43._24_4_ = auVar43._0_4_;
      auVar43._28_4_ = auVar43._0_4_;
      auVar43 = vfmsub231ps_avx512vl(auVar43,auVar41,auVar39);
      auVar32 = vmulss_avx512f(auVar39._0_16_,auVar40._0_16_);
      auVar44._0_4_ = auVar32._0_4_;
      auVar44._4_4_ = auVar44._0_4_;
      auVar44._8_4_ = auVar44._0_4_;
      auVar44._12_4_ = auVar44._0_4_;
      auVar44._16_4_ = auVar44._0_4_;
      auVar44._20_4_ = auVar44._0_4_;
      auVar44._24_4_ = auVar44._0_4_;
      auVar44._28_4_ = auVar44._0_4_;
      auVar44 = vfmsub231ps_avx512vl(auVar44,auVar42,auVar57);
      auVar32 = vmulss_avx512f(auVar56,auVar41._0_16_);
      auVar45 = vbroadcastss_avx512vl(auVar32);
      auVar45 = vfmsub231ps_avx512vl(auVar45,auVar40,auVar38);
      auVar46 = vmulps_avx512vl(auVar35,auVar50);
      auVar46 = vfmsub231ps_avx512vl(auVar46,auVar9,auVar36);
      auVar47 = vmulps_avx512vl(auVar36,auVar51);
      auVar47 = vfmsub231ps_avx512vl(auVar47,auVar50,auVar34);
      auVar48 = vmulps_avx512vl(auVar34,auVar9);
      auVar48 = vfmsub231ps_avx512vl(auVar48,auVar51,auVar35);
      auVar49 = vmulps_avx512vl(auVar45,auVar36);
      auVar49 = vfmadd231ps_avx512vl(auVar49,auVar44,auVar35);
      auVar49 = vfmadd231ps_avx512vl(auVar49,auVar43,auVar34);
      vandps_avx512vl(auVar49,auVar61._0_32_);
      auVar42 = vmulps_avx512vl(auVar42,auVar48);
      auVar41 = vfmadd231ps_avx512vl(auVar42,auVar47,auVar41);
      auVar40 = vfmadd231ps_avx512vl(auVar41,auVar46,auVar40);
      auVar40 = vxorps_avx512vl(auVar49,auVar40);
      uVar10 = vcmpps_avx512vl(auVar40,auVar62._0_32_,5);
      bVar24 = (byte)uVar10 & bVar21;
      if (bVar24 == 0) {
LAB_008722e3:
        bVar24 = 0;
      }
      else {
        auVar39 = vmulps_avx512vl(auVar39,auVar48);
        auVar38 = vfmadd213ps_avx512vl(auVar47,auVar38,auVar39);
        auVar38 = vfmadd213ps_avx512vl(auVar46,auVar57,auVar38);
        auVar38 = vxorps_avx512vl(auVar49,auVar38);
        uVar10 = vcmpps_avx512vl(auVar38,auVar62._0_32_,5);
        bVar24 = bVar24 & (byte)uVar10;
        if (bVar24 == 0) goto LAB_008722e3;
        auVar41 = auVar58._0_32_;
        vandps_avx512vl(auVar49,auVar41);
        auVar39 = vsubps_avx512vl(auVar41,auVar40);
        uVar10 = vcmpps_avx512vl(auVar39,auVar38,5);
        bVar24 = bVar24 & (byte)uVar10;
        auVar32 = auVar62._0_16_;
        if (bVar24 == 0) {
LAB_0087236e:
          bVar24 = 0;
          auVar58 = ZEXT3264(auVar41);
          auVar32 = vxorps_avx512vl(auVar32,auVar32);
          auVar62 = ZEXT1664(auVar32);
        }
        else {
          auVar50 = vmulps_avx512vl(auVar45,auVar50);
          auVar56 = vfmadd213ps_fma(auVar9,auVar44,auVar50);
          auVar56 = vfmadd213ps_fma(auVar51,auVar43,ZEXT1632(auVar56));
          auVar51 = vxorps_avx512vl(auVar49,ZEXT1632(auVar56));
          auVar40._0_4_ = auVar58._0_4_ * auVar33._0_4_;
          auVar40._4_4_ = auVar58._4_4_ * auVar33._4_4_;
          auVar40._8_4_ = auVar58._8_4_ * auVar33._8_4_;
          auVar40._12_4_ = auVar58._12_4_ * auVar33._12_4_;
          auVar40._16_4_ = auVar58._16_4_ * auVar33._16_4_;
          auVar40._20_4_ = auVar58._20_4_ * auVar33._20_4_;
          auVar40._24_4_ = auVar58._24_4_ * auVar33._24_4_;
          auVar40._28_4_ = 0;
          auVar39._4_4_ = auVar58._4_4_ * auVar37._4_4_;
          auVar39._0_4_ = auVar58._0_4_ * auVar37._0_4_;
          auVar39._8_4_ = auVar58._8_4_ * auVar37._8_4_;
          auVar39._12_4_ = auVar58._12_4_ * auVar37._12_4_;
          auVar39._16_4_ = auVar58._16_4_ * auVar37._16_4_;
          auVar39._20_4_ = auVar58._20_4_ * auVar37._20_4_;
          auVar39._24_4_ = auVar58._24_4_ * auVar37._24_4_;
          auVar39._28_4_ = auVar50._28_4_;
          uVar10 = vcmpps_avx512vl(auVar51,auVar39,2);
          uVar11 = vcmpps_avx512vl(auVar40,auVar51,1);
          bVar24 = bVar24 & (byte)uVar10 & (byte)uVar11;
          if (bVar24 == 0) goto LAB_0087236e;
          auVar32 = vxorps_avx512vl(auVar32,auVar32);
          auVar62 = ZEXT1664(auVar32);
          uVar10 = vcmpps_avx512vl(auVar49,ZEXT1632(auVar32),4);
          bVar24 = bVar24 & (byte)uVar10;
          auVar58 = ZEXT3264(auVar41);
        }
      }
      uVar1 = ((local_5a78->scene->geometries).items[uVar23].ptr)->mask;
      auVar42._4_4_ = uVar1;
      auVar42._0_4_ = uVar1;
      auVar42._8_4_ = uVar1;
      auVar42._12_4_ = uVar1;
      auVar42._16_4_ = uVar1;
      auVar42._20_4_ = uVar1;
      auVar42._24_4_ = uVar1;
      auVar42._28_4_ = uVar1;
      uVar10 = vptestmd_avx512vl(*(undefined1 (*) [32])(local_5a88 + 0x120),auVar42);
      bVar21 = bVar21 & ~((byte)uVar10 & bVar24);
      if ((bVar21 == 0) || (bVar30 = 2 < uVar22, uVar22 = uVar22 + 1, bVar30)) break;
    }
    bVar19 = bVar19 & bVar21;
    if (bVar19 == 0) break;
  }
  bVar19 = ~bVar19;
LAB_00872402:
  bVar17 = bVar17 | bVar19;
  if (bVar17 == 0xff) {
LAB_0087242a:
    iVar18 = 3;
  }
  else {
    auVar33 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
    local_5840 = (uint)(bVar17 & 1) * auVar33._0_4_ | !(bool)(bVar17 & 1) * local_5840;
    bVar30 = (bool)(bVar17 >> 1 & 1);
    uStack_583c = (uint)bVar30 * auVar33._4_4_ | !bVar30 * uStack_583c;
    bVar30 = (bool)(bVar17 >> 2 & 1);
    uStack_5838 = (uint)bVar30 * auVar33._8_4_ | !bVar30 * uStack_5838;
    bVar30 = (bool)(bVar17 >> 3 & 1);
    uStack_5834 = (uint)bVar30 * auVar33._12_4_ | !bVar30 * uStack_5834;
    bVar30 = (bool)(bVar17 >> 4 & 1);
    uStack_5830 = (uint)bVar30 * auVar33._16_4_ | !bVar30 * uStack_5830;
    bVar30 = (bool)(bVar17 >> 5 & 1);
    uStack_582c = (uint)bVar30 * auVar33._20_4_ | !bVar30 * uStack_582c;
    bVar30 = (bool)(bVar17 >> 6 & 1);
    uStack_5828 = (uint)bVar30 * auVar33._24_4_ | !bVar30 * uStack_5828;
    uStack_5824 = (uint)(bVar17 >> 7) * auVar33._28_4_ | !(bool)(bVar17 >> 7) * uStack_5824;
    iVar18 = 0;
  }
LAB_00872430:
  if (iVar18 == 3) {
    bVar17 = bVar17 & (byte)local_5a8c;
    bVar30 = (bool)(bVar17 >> 1 & 1);
    bVar2 = (bool)(bVar17 >> 2 & 1);
    bVar3 = (bool)(bVar17 >> 3 & 1);
    bVar4 = (bool)(bVar17 >> 4 & 1);
    bVar5 = (bool)(bVar17 >> 5 & 1);
    bVar6 = (bool)(bVar17 >> 6 & 1);
    *(uint *)local_5a68 =
         (uint)(bVar17 & 1) * auVar59._0_4_ | (uint)!(bool)(bVar17 & 1) * *(int *)local_5a68;
    *(uint *)(local_5a68 + 4) =
         (uint)bVar30 * auVar59._4_4_ | (uint)!bVar30 * *(int *)(local_5a68 + 4);
    *(uint *)(local_5a68 + 8) =
         (uint)bVar2 * auVar59._8_4_ | (uint)!bVar2 * *(int *)(local_5a68 + 8);
    *(uint *)(local_5a68 + 0xc) =
         (uint)bVar3 * auVar59._12_4_ | (uint)!bVar3 * *(int *)(local_5a68 + 0xc);
    *(uint *)(local_5a68 + 0x10) =
         (uint)bVar4 * auVar59._16_4_ | (uint)!bVar4 * *(int *)(local_5a68 + 0x10);
    *(uint *)(local_5a68 + 0x14) =
         (uint)bVar5 * auVar59._20_4_ | (uint)!bVar5 * *(int *)(local_5a68 + 0x14);
    *(uint *)(local_5a68 + 0x18) =
         (uint)bVar6 * auVar59._24_4_ | (uint)!bVar6 * *(int *)(local_5a68 + 0x18);
    *(uint *)(local_5a68 + 0x1c) =
         (uint)(bVar17 >> 7) * auVar59._28_4_ |
         (uint)!(bool)(bVar17 >> 7) * *(int *)(local_5a68 + 0x1c);
    return;
  }
  goto LAB_00871f81;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded(vint<K>* __restrict__ valid_i,
                                                                                              Accel::Intersectors* __restrict__ This,
                                                                                              RayK<K>& __restrict__ ray,
                                                                                              RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        occludedCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out already occluded and invalid rays */
      vbool<K> valid = (*valid_i == -1) & (ray.tfar >= 0.0f);
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      const size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
      tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));

      vbool<K> terminated = !valid;
      const vfloat<K> inf = vfloat<K>(pos_inf);

      /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      /* allocate stack and push root node */
      vfloat<K> stack_near[stackSizeChunk];
      NodeRef stack_node[stackSizeChunk];
      stack_node[0] = BVH::invalidNode;
      stack_near[0] = inf;
      stack_node[1] = bvh->root;
      stack_near[1] = tray.tnear;
      NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
      NodeRef* __restrict__ sptr_node = stack_node + 2;
      vfloat<K>* __restrict__ sptr_near = stack_near + 2;

      while (1) pop:
      {
        /* pop next node from stack */
        assert(sptr_node > stack_node);
        sptr_node--;
        sptr_near--;
        NodeRef cur = *sptr_node;
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }

        /* cull node if behind closest hit point */
        vfloat<K> curDist = *sptr_near;
        const vbool<K> active = curDist < tray.tfar;
        if (unlikely(none(active)))
          continue;

        /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
        if (single)
#endif
        {
          size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
          if (unlikely(popcnt(bits) <= switchThreshold)) 
#endif
          {
            for (; bits!=0; ) {
              const size_t i = bscf(bits);
              if (occluded1(This, bvh, cur, i, pre, ray, tray, context))
                set(terminated, i);
            }
            if (all(terminated)) break;
            tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar);
            continue;
          }
        }
#endif

        while (likely(!cur.isLeaf()))
        {
          /* process nodes */
          const vbool<K> valid_node = tray.tfar > curDist;
          STAT3(shadow.trav_nodes, 1, popcnt(valid_node), K);
          const NodeRef nodeRef = cur;
          const BaseNode* __restrict__ const node = nodeRef.baseNode();

          /* set cur to invalid */
          cur = BVH::emptyNode;
          curDist = pos_inf;

          for (unsigned i = 0; i < N; i++)
          {
            const NodeRef child = node->children[i];
            if (unlikely(child == BVH::emptyNode)) break;
            vfloat<K> lnearP;
            vbool<K> lhit = valid_node;
            BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

            /* if we hit the child we push the previously hit node onto the stack, and continue with the currently hit child */
            if (likely(any(lhit)))
            {
              assert(sptr_node < stackEnd);
              assert(child != BVH::emptyNode);
              const vfloat<K> childDist = select(lhit, lnearP, inf);

              /* push 'cur' node onto stack and continue with hit child */
              if (likely(cur != BVH::emptyNode)) {
                *sptr_node = cur; sptr_node++;
                *sptr_near = curDist; sptr_near++;
              }
              curDist = childDist;
              cur = child;
            }
          }
          if (unlikely(cur == BVH::emptyNode))
            goto pop;

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
          if (single)
          {
            // seems to be the best place for testing utilization
            if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
            {
              *sptr_node++ = cur;
              *sptr_near++ = curDist;
              goto pop;
            }
          }
#endif
	}

        /* return if stack is empty */
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }


        /* intersect leaf */
        assert(cur != BVH::emptyNode);
        const vbool<K> valid_leaf = tray.tfar > curDist;
        STAT3(shadow.trav_leaves, 1, popcnt(valid_leaf), K);
        if (unlikely(none(valid_leaf))) continue;
        size_t items; const Primitive* prim = (Primitive*) cur.leaf(items);

        size_t lazy_node = 0;
        terminated |= PrimitiveIntersectorK::occluded(!terminated, This, pre, ray, context, prim, items, tray, lazy_node);
        if (all(terminated)) break;
        tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar); // ignore node intersections for terminated rays

        if (unlikely(lazy_node)) {
          *sptr_node = lazy_node; sptr_node++;
          *sptr_near = neg_inf;   sptr_near++;
        }
      }

      vfloat<K>::store(valid & terminated, &ray.tfar, neg_inf);
    }